

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckInt(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,int64_t i)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  ValueType *actualType;
  Ch *pCVar4;
  ulong uVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  ValidateErrorCode validateErrorCode;
  
  if ((this->type_ & 0x60) == 0) {
    actualType = GetIntegerString();
    DisallowedType(this,context,actualType);
    context->invalidCode = kValidateErrorType;
    this_00 = GetTypeString();
    goto LAB_0012f653;
  }
  uVar1 = (this->minimum_).data_.f.flags;
  if (uVar1 == 0) {
LAB_0012f5e1:
    uVar1 = (this->maximum_).data_.f.flags;
    if (uVar1 != 0) {
      if ((char)uVar1 < '\0') {
        lVar2 = *(long *)&(this->maximum_).data_;
        if (this->exclusiveMaximum_ == true) {
          if (lVar2 <= i) {
LAB_0012f628:
            (*context->error_handler->_vptr_IValidationErrorHandler[5])
                      (context->error_handler,i,&this->maximum_,(ulong)this->exclusiveMaximum_);
            validateErrorCode = (uint)this->exclusiveMaximum_ | kValidateErrorMaximum;
            goto LAB_0012f64b;
          }
        }
        else if (lVar2 < i) goto LAB_0012f628;
      }
      else if (((uVar1 >> 8 & 1) == 0) &&
              (bVar3 = CheckDoubleMaximum(this,context,(double)i), !bVar3)) {
        return false;
      }
    }
    uVar1 = (this->multipleOf_).data_.f.flags;
    if (uVar1 == 0) {
      return true;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      bVar3 = CheckDoubleMultipleOf(this,context,(double)i);
      if (!bVar3) {
        return false;
      }
      return true;
    }
    uVar5 = -i;
    if (0 < i) {
      uVar5 = i;
    }
    if (uVar5 % *(ulong *)&(this->multipleOf_).data_ == 0) {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[2])
              (context->error_handler,i,&this->multipleOf_);
    context->invalidCode = kValidateErrorMultipleOf;
    this_00 = GetMultipleOfString();
  }
  else {
    if ((char)uVar1 < '\0') {
      lVar2 = *(long *)&(this->minimum_).data_;
      if (this->exclusiveMinimum_ == true) {
        if (i <= lVar2) {
LAB_0012f5a7:
          (*context->error_handler->_vptr_IValidationErrorHandler[8])
                    (context->error_handler,i,&this->minimum_,(ulong)this->exclusiveMinimum_);
          goto LAB_0012f5cf;
        }
      }
      else if (i < lVar2) goto LAB_0012f5a7;
      goto LAB_0012f5e1;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      bVar3 = CheckDoubleMinimum(this,context,(double)i);
      if (!bVar3) {
        return false;
      }
      goto LAB_0012f5e1;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[8])
              (context->error_handler,i,&this->minimum_,(ulong)this->exclusiveMinimum_);
LAB_0012f5cf:
    validateErrorCode = (uint)this->exclusiveMinimum_ | kValidateErrorMinimum;
LAB_0012f64b:
    context->invalidCode = validateErrorCode;
    this_00 = GetValidateErrorKeyword(validateErrorCode);
  }
LAB_0012f653:
  pCVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar4;
  return false;
}

Assistant:

bool CheckInt(Context& context, int64_t i) const {
        if (!(type_ & ((1 << kIntegerSchemaType) | (1 << kNumberSchemaType)))) {
            DisallowedType(context, GetIntegerString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (!minimum_.IsNull()) {
            if (minimum_.IsInt64()) {
                if (exclusiveMinimum_ ? i <= minimum_.GetInt64() : i < minimum_.GetInt64()) {
                    context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum);
                }
            }
            else if (minimum_.IsUint64()) {
                context.error_handler.BelowMinimum(i, minimum_, exclusiveMinimum_);
                RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum); // i <= max(int64_t) < minimum.GetUint64()
            }
            else if (!CheckDoubleMinimum(context, static_cast<double>(i)))
                return false;
        }

        if (!maximum_.IsNull()) {
            if (maximum_.IsInt64()) {
                if (exclusiveMaximum_ ? i >= maximum_.GetInt64() : i > maximum_.GetInt64()) {
                    context.error_handler.AboveMaximum(i, maximum_, exclusiveMaximum_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMaximum_ ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum);
                }
            }
            else if (maximum_.IsUint64()) { }
                /* do nothing */ // i <= max(int64_t) < maximum_.GetUint64()
            else if (!CheckDoubleMaximum(context, static_cast<double>(i)))
                return false;
        }

        if (!multipleOf_.IsNull()) {
            if (multipleOf_.IsUint64()) {
                if (static_cast<uint64_t>(i >= 0 ? i : -i) % multipleOf_.GetUint64() != 0) {
                    context.error_handler.NotMultipleOf(i, multipleOf_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMultipleOf);
                }
            }
            else if (!CheckDoubleMultipleOf(context, static_cast<double>(i)))
                return false;
        }

        return true;
    }